

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_local_gem(REF_CELL ref_cell,REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_BOOL *local)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  *local = 0;
  iVar5 = -1;
  uVar6 = 0xffffffff;
  if (-1 < node0) {
    pRVar2 = ref_cell->ref_adj;
    uVar6 = 0xffffffff;
    iVar5 = -1;
    if (node0 < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)node0];
      uVar6 = 0xffffffff;
      iVar5 = -1;
      if ((long)(int)uVar1 != -1) {
        iVar5 = pRVar2->item[(int)uVar1].ref;
        uVar6 = (ulong)uVar1;
      }
    }
  }
  do {
    if ((int)uVar6 == -1) {
      *local = 1;
      return 0;
    }
    uVar1 = ref_cell->node_per;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = uVar1;
    }
    for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
      lVar9 = (long)ref_cell->size_per * (long)iVar5;
      if (ref_cell->c2n[(int)((int)lVar9 + uVar7)] == node1) {
        uVar10 = 0;
        while (uVar1 != uVar10) {
          lVar4 = lVar9 + uVar10;
          uVar10 = uVar10 + 1;
          if (ref_node->ref_mpi->id != ref_node->part[ref_cell->c2n[lVar4]]) {
            return 0;
          }
        }
      }
    }
    pRVar3 = ref_cell->ref_adj->item;
    uVar6 = (ulong)pRVar3[(int)uVar6].next;
    iVar5 = -1;
    if (uVar6 != 0xffffffffffffffff) {
      iVar5 = pRVar3[uVar6].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_local_gem(REF_CELL ref_cell, REF_NODE ref_node,
                                      REF_INT node0, REF_INT node1,
                                      REF_BOOL *local) {
  REF_INT item, cell, search_node, test_node;

  *local = REF_FALSE;

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (search_node = 0; search_node < ref_cell_node_per(ref_cell);
         search_node++) {
      if (node1 == ref_cell_c2n(ref_cell, search_node, cell)) {
        for (test_node = 0; test_node < ref_cell_node_per(ref_cell);
             test_node++) {
          if (!ref_node_owned(ref_node,
                              ref_cell_c2n(ref_cell, test_node, cell))) {
            return REF_SUCCESS;
          }
        }
      }
    }
  }

  *local = REF_TRUE;

  return REF_SUCCESS;
}